

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  NodeRef *pNVar15;
  size_t sVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  uint uVar22;
  Primitive_conflict4 *prim;
  bool bVar23;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [64];
  vfloat_impl<4> __tmp;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  undefined1 in_ZMM1 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar29;
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_2;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_1;
  undefined1 auVar44 [16];
  vint4 bi_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_2;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  Precalculations pre;
  undefined1 local_3578 [16];
  vbool<4> valid_leaf;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  sVar18 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar18 != 8) {
    auVar7 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    auVar7 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar7);
    if ((((auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar7[0xf] < '\0') {
      auVar6 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar48 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      aVar3.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar6,auVar7);
      fVar8 = *(float *)ray;
      fVar9 = *(float *)(ray + 4);
      fVar10 = *(float *)(ray + 8);
      fVar11 = *(float *)(ray + 0xc);
      auVar7 = *(undefined1 (*) [16])(ray + 0x10);
      auVar6 = *(undefined1 (*) [16])(ray + 0x20);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar18;
      stack_near[1].field_0 = aVar3;
      if (sVar18 != 0xfffffffffffffff8) {
        auVar45._8_4_ = 0x7fffffff;
        auVar45._0_8_ = 0x7fffffff7fffffff;
        auVar45._12_4_ = 0x7fffffff;
        auVar28 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar45);
        auVar47._8_4_ = 0x219392ef;
        auVar47._0_8_ = 0x219392ef219392ef;
        auVar47._12_4_ = 0x219392ef;
        auVar28 = vcmpps_avx(auVar28,auVar47,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar47,auVar28);
        auVar28 = vandps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x50));
        auVar28 = vcmpps_avx(auVar28,auVar47,1);
        auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar47,auVar28);
        auVar28 = vandps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x60));
        auVar28 = vcmpps_avx(auVar28,auVar47,1);
        auVar28 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar47,auVar28);
        auVar45 = vrcpps_avx(auVar4);
        auVar42._8_4_ = 0x3f800000;
        auVar42._0_8_ = 0x3f8000003f800000;
        auVar42._12_4_ = 0x3f800000;
        auVar27 = vfnmadd213ps_fma(auVar4,auVar45,auVar42);
        auVar4 = vrcpps_avx(auVar5);
        auVar30 = vfnmadd213ps_fma(auVar5,auVar4,auVar42);
        auVar5 = vrcpps_avx(auVar28);
        auVar28 = vfnmadd213ps_fma(auVar28,auVar5,auVar42);
        auVar45 = vfmadd132ps_fma(auVar27,auVar45,auVar45);
        auVar4 = vfmadd132ps_fma(auVar30,auVar4,auVar4);
        auVar5 = vfmadd132ps_fma(auVar28,auVar5,auVar5);
        auVar30._0_4_ = auVar5._0_4_ * -auVar6._0_4_;
        auVar30._4_4_ = auVar5._4_4_ * -auVar6._4_4_;
        auVar30._8_4_ = auVar5._8_4_ * -auVar6._8_4_;
        auVar30._12_4_ = auVar5._12_4_ * -auVar6._12_4_;
        auVar6 = vpcmpeqd_avx(auVar30,auVar30);
        auVar28 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar6);
        pNVar15 = stack_node + 1;
        auVar6 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        auVar27._8_4_ = 0xff800000;
        auVar27._0_8_ = 0xff800000ff800000;
        auVar27._12_4_ = 0xff800000;
        local_3578 = vblendvps_avx(auVar27,auVar6,auVar28);
        paVar21 = &stack_near[2].field_0;
        do {
          paVar1 = paVar21 + -1;
          auVar25 = ZEXT1664((undefined1  [16])*paVar1);
          paVar21 = paVar21 + -1;
          auVar6 = vcmpps_avx((undefined1  [16])*paVar1,local_3578,1);
          if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar6[0xf] < '\0') {
            while( true ) {
              uVar22 = (uint)sVar18;
              if ((sVar18 & 8) != 0) break;
              uVar17 = sVar18 & 0xfffffffffffffff0;
              auVar6 = vcmpps_avx(local_3578,auVar25._0_16_,6);
              uVar14 = 0;
              auVar25 = ZEXT1664(auVar48._0_16_);
              lVar20 = -0x20;
              sVar18 = 8;
              do {
                sVar19 = *(size_t *)(uVar17 + 0x40 + lVar20 * 2);
                if (sVar19 == 8) break;
                uVar2 = *(undefined4 *)(uVar17 + 0x120 + lVar20);
                auVar32._4_4_ = uVar2;
                auVar32._0_4_ = uVar2;
                auVar32._8_4_ = uVar2;
                auVar32._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x60 + lVar20);
                auVar31._4_4_ = uVar2;
                auVar31._0_4_ = uVar2;
                auVar31._8_4_ = uVar2;
                auVar31._12_4_ = uVar2;
                auVar28 = *(undefined1 (*) [16])(ray + 0x70);
                auVar27 = vfmadd231ps_fma(auVar31,auVar28,auVar32);
                uVar2 = *(undefined4 *)(uVar17 + 0x160 + lVar20);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0xa0 + lVar20);
                auVar33._4_4_ = uVar2;
                auVar33._0_4_ = uVar2;
                auVar33._8_4_ = uVar2;
                auVar33._12_4_ = uVar2;
                auVar42 = vfmadd231ps_fma(auVar33,auVar28,auVar35);
                uVar2 = *(undefined4 *)(uVar17 + 0x1a0 + lVar20);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0xe0 + lVar20);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar32 = vfmadd231ps_fma(auVar36,auVar28,auVar38);
                uVar2 = *(undefined4 *)(uVar17 + 0x140 + lVar20);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x80 + lVar20);
                auVar43._4_4_ = uVar2;
                auVar43._0_4_ = uVar2;
                auVar43._8_4_ = uVar2;
                auVar43._12_4_ = uVar2;
                auVar33 = vfmadd231ps_fma(auVar43,auVar28,auVar39);
                uVar2 = *(undefined4 *)(uVar17 + 0x180 + lVar20);
                auVar40._4_4_ = uVar2;
                auVar40._0_4_ = uVar2;
                auVar40._8_4_ = uVar2;
                auVar40._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0xc0 + lVar20);
                auVar44._4_4_ = uVar2;
                auVar44._0_4_ = uVar2;
                auVar44._8_4_ = uVar2;
                auVar44._12_4_ = uVar2;
                auVar35 = vfmadd231ps_fma(auVar44,auVar28,auVar40);
                uVar2 = *(undefined4 *)(uVar17 + 0x1c0 + lVar20);
                auVar41._4_4_ = uVar2;
                auVar41._0_4_ = uVar2;
                auVar41._8_4_ = uVar2;
                auVar41._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x100 + lVar20);
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar36 = vfmadd231ps_fma(auVar46,auVar28,auVar41);
                auVar13._4_4_ = auVar45._4_4_ * -fVar9;
                auVar13._0_4_ = auVar45._0_4_ * -fVar8;
                auVar13._8_4_ = auVar45._8_4_ * -fVar10;
                auVar13._12_4_ = auVar45._12_4_ * -fVar11;
                auVar47 = vfmadd213ps_fma(auVar27,auVar45,auVar13);
                auVar12._4_4_ = auVar4._4_4_ * -auVar7._4_4_;
                auVar12._0_4_ = auVar4._0_4_ * -auVar7._0_4_;
                auVar12._8_4_ = auVar4._8_4_ * -auVar7._8_4_;
                auVar12._12_4_ = auVar4._12_4_ * -auVar7._12_4_;
                auVar31 = vfmadd213ps_fma(auVar42,auVar4,auVar12);
                auVar32 = vfmadd213ps_fma(auVar32,auVar5,auVar30);
                auVar33 = vfmadd213ps_fma(auVar33,auVar45,auVar13);
                auVar35 = vfmadd213ps_fma(auVar35,auVar4,auVar12);
                auVar36 = vfmadd213ps_fma(auVar36,auVar5,auVar30);
                auVar27 = vpminsd_avx(auVar47,auVar33);
                auVar42 = vpminsd_avx(auVar31,auVar35);
                auVar27 = vpmaxsd_avx(auVar27,auVar42);
                auVar42 = vpminsd_avx(auVar32,auVar36);
                auVar27 = vpmaxsd_avx(auVar27,auVar42);
                auVar42 = vpmaxsd_avx(auVar47,auVar33);
                auVar47 = vpmaxsd_avx(auVar31,auVar35);
                auVar47 = vpminsd_avx(auVar42,auVar47);
                auVar42 = vpmaxsd_avx(auVar32,auVar36);
                auVar42 = vpminsd_avx(auVar42,local_3578);
                auVar47 = vpminsd_avx(auVar47,auVar42);
                auVar42 = vpmaxsd_avx(auVar27,(undefined1  [16])aVar3);
                if ((uVar22 & 7) == 6) {
                  auVar42 = vcmpps_avx(auVar42,auVar47,2);
                  uVar2 = *(undefined4 *)(uVar17 + 0x1e0 + lVar20);
                  auVar34._4_4_ = uVar2;
                  auVar34._0_4_ = uVar2;
                  auVar34._8_4_ = uVar2;
                  auVar34._12_4_ = uVar2;
                  auVar47 = vcmpps_avx(auVar34,auVar28,2);
                  uVar2 = *(undefined4 *)(uVar17 + 0x200 + lVar20);
                  auVar37._4_4_ = uVar2;
                  auVar37._0_4_ = uVar2;
                  auVar37._8_4_ = uVar2;
                  auVar37._12_4_ = uVar2;
                  auVar28 = vcmpps_avx(auVar28,auVar37,1);
                  auVar28 = vandps_avx(auVar47,auVar28);
                  auVar28 = vandps_avx(auVar28,auVar42);
                }
                else {
                  auVar28 = vcmpps_avx(auVar42,auVar47,2);
                }
                auVar28 = vandps_avx(auVar28,auVar6);
                auVar28 = vpslld_avx(auVar28,0x1f);
                if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar28[0xf] < '\0') {
                  aVar29 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar48._0_16_,auVar27,auVar28);
                  aVar24 = auVar25._0_16_;
                  auVar28 = vcmpps_avx((undefined1  [16])aVar29,(undefined1  [16])aVar24,1);
                  sVar16 = sVar19;
                  aVar26 = aVar29;
                  if (((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar28[0xf]) ||
                     (bVar23 = sVar18 != 8, sVar16 = sVar18, sVar18 = sVar19, aVar26 = aVar24,
                     aVar24 = aVar29, bVar23)) {
                    aVar29 = aVar24;
                    uVar14 = uVar14 + 1;
                    pNVar15->ptr = sVar16;
                    pNVar15 = pNVar15 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar26;
                    paVar21 = paVar21 + 1;
                    sVar19 = sVar18;
                  }
                  auVar25 = ZEXT1664((undefined1  [16])aVar29);
                  sVar18 = sVar19;
                }
                lVar20 = lVar20 + 4;
              } while (lVar20 != 0);
              if (sVar18 == 8) goto LAB_005b8da7;
              if (1 < uVar14) {
                aVar29 = paVar21[-2];
                aVar26 = paVar21[-1];
                auVar6 = vcmpps_avx((undefined1  [16])aVar29,(undefined1  [16])aVar26,1);
                aVar24 = aVar26;
                if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar6[0xf] < '\0') {
                  paVar21[-2] = aVar26;
                  paVar21[-1] = aVar29;
                  auVar6 = vpermilps_avx(*(undefined1 (*) [16])(pNVar15 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar15 + -2) = auVar6;
                  aVar24 = aVar29;
                  aVar29 = aVar26;
                }
                if (uVar14 != 2) {
                  aVar26 = paVar21[-3];
                  auVar6 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar24,1);
                  if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar6[0xf] < '\0') {
                    paVar21[-3] = aVar24;
                    paVar21[-1] = aVar26;
                    sVar19 = pNVar15[-3].ptr;
                    pNVar15[-3].ptr = pNVar15[-1].ptr;
                    pNVar15[-1].ptr = sVar19;
                    aVar26 = aVar24;
                  }
                  auVar6 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar29,1);
                  if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar6 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar6[0xf] < '\0') {
                    paVar21[-3] = aVar29;
                    paVar21[-2] = aVar26;
                    auVar6 = vpermilps_avx(*(undefined1 (*) [16])(pNVar15 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar15 + -3) = auVar6;
                  }
                }
              }
            }
            if (sVar18 == 0xfffffffffffffff8) {
              return;
            }
            valid_leaf.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vcmpps_avx(local_3578,auVar25._0_16_,6);
            if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0 ||
                 ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                 (undefined1  [16])0x0) ||
                ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
              lVar20 = (ulong)(uVar22 & 0xf) - 8;
              if (lVar20 != 0) {
                prim = (Primitive_conflict4 *)(sVar18 & 0xfffffffffffffff0);
                do {
                  InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                  prim = prim + 1;
                  lVar20 = lVar20 + -1;
                } while (lVar20 != 0);
                auVar48 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              local_3578 = vblendvps_avx(local_3578,*(undefined1 (*) [16])(ray + 0x80),
                                         (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_005b8da7:
          sVar18 = pNVar15[-1].ptr;
          pNVar15 = pNVar15 + -1;
        } while (sVar18 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }